

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O3

void __thiscall helics::BrokerBase::configureBase(BrokerBase *this)

{
  pointer pcVar1;
  BaseTimeCoordinator *pBVar2;
  size_type sVar3;
  BaseTimeCoordinator *pBVar4;
  ForwardingTimeCoordinator *this_00;
  thread local_88;
  _Any_data local_80;
  code *local_70;
  code *local_68;
  BrokerBase *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  if (this->debugging == true) {
    this->no_ping = true;
    this->disable_timer = true;
  }
  if ((this->networkTimeout).internalTimeCode < 0) {
    (this->networkTimeout).internalTimeCode = 4000000000;
  }
  sVar3 = (this->identifier)._M_string_length;
  if (sVar3 == 0 && this->noAutomaticID == false) {
    genId_abi_cxx11_();
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&this->identifier,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    sVar3 = (this->identifier)._M_string_length;
  }
  if ((((sVar3 == 0x24) && (pcVar1 = (this->identifier)._M_dataplus._M_p, pcVar1[8] == '-')) &&
      (pcVar1[0xc] == '-')) && ((pcVar1[0x10] == '-' && (pcVar1[0x14] == '-')))) {
    this->uuid_like = true;
  }
  if (this->asyncTime == true) {
    pBVar4 = (BaseTimeCoordinator *)operator_new(0x78);
    pBVar4->_vptr_BaseTimeCoordinator = (_func_int **)0x0;
    (pBVar4->dependencies).dependencies.
    super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pBVar4->dependencies).dependencies.
    super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pBVar4->dependencies).dependencies.
    super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    *(undefined8 *)&(pBVar4->dependencies).mDelayedDependency = 0;
    *(undefined8 *)&(pBVar4->sendMessageFunction).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(pBVar4->sendMessageFunction).super__Function_base._M_functor + 8) = 0;
    (pBVar4->sendMessageFunction).super__Function_base._M_manager = (_Manager_type)0x0;
    (pBVar4->sendMessageFunction)._M_invoker = (_Invoker_type)0x0;
    pBVar4->mSourceId = 0;
    pBVar4->sequenceCounter = 0;
    pBVar4->noParent = false;
    pBVar4->federatesOnly = false;
    pBVar4->checkingExec = false;
    pBVar4->executionMode = false;
    pBVar4->restrictive_time_policy = false;
    pBVar4->nonGranting = false;
    pBVar4->delayedTiming = false;
    pBVar4->disconnected = false;
    pBVar4[1]._vptr_BaseTimeCoordinator = (_func_int **)0x0;
    pBVar4[1].dependencies.dependencies.
    super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    pBVar4[1].dependencies.dependencies.
    super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pBVar4[1].dependencies.dependencies.
    super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    BaseTimeCoordinator::BaseTimeCoordinator(pBVar4);
    pBVar4->_vptr_BaseTimeCoordinator = (_func_int **)&PTR__BaseTimeCoordinator_0055c6d0;
    pBVar4[1]._vptr_BaseTimeCoordinator = (_func_int **)0x8000000000000001;
    *(undefined1 *)
     &pBVar4[1].dependencies.dependencies.
      super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
      super__Vector_impl_data._M_start = 0;
    pBVar4[1].dependencies.dependencies.
    super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x7fffffffffffffff;
    *(undefined1 *)
     &pBVar4[1].dependencies.dependencies.
      super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = 0;
  }
  else {
    if (this->globalTime != true) {
      this_00 = (ForwardingTimeCoordinator *)operator_new(0x110);
      memset(this_00,0,0x110);
      ForwardingTimeCoordinator::ForwardingTimeCoordinator(this_00);
      pBVar4 = (this->timeCoord)._M_t.
               super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
               .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
      (this->timeCoord)._M_t.
      super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
      ._M_t.
      super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
      .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl =
           (BaseTimeCoordinator *)this_00;
      if (pBVar4 != (BaseTimeCoordinator *)0x0) {
        (*pBVar4->_vptr_BaseTimeCoordinator[1])();
      }
      goto LAB_002e301d;
    }
    pBVar4 = (BaseTimeCoordinator *)operator_new(0x78);
    pBVar4->_vptr_BaseTimeCoordinator = (_func_int **)0x0;
    (pBVar4->dependencies).dependencies.
    super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pBVar4->dependencies).dependencies.
    super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pBVar4->dependencies).dependencies.
    super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    *(undefined8 *)&(pBVar4->dependencies).mDelayedDependency = 0;
    *(undefined8 *)&(pBVar4->sendMessageFunction).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(pBVar4->sendMessageFunction).super__Function_base._M_functor + 8) = 0;
    (pBVar4->sendMessageFunction).super__Function_base._M_manager = (_Manager_type)0x0;
    (pBVar4->sendMessageFunction)._M_invoker = (_Invoker_type)0x0;
    pBVar4->mSourceId = 0;
    pBVar4->sequenceCounter = 0;
    pBVar4->noParent = false;
    pBVar4->federatesOnly = false;
    pBVar4->checkingExec = false;
    pBVar4->executionMode = false;
    pBVar4->restrictive_time_policy = false;
    pBVar4->nonGranting = false;
    pBVar4->delayedTiming = false;
    pBVar4->disconnected = false;
    pBVar4[1]._vptr_BaseTimeCoordinator = (_func_int **)0x0;
    pBVar4[1].dependencies.dependencies.
    super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    pBVar4[1].dependencies.dependencies.
    super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pBVar4[1].dependencies.dependencies.
    super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    BaseTimeCoordinator::BaseTimeCoordinator(pBVar4);
    pBVar4->_vptr_BaseTimeCoordinator = (_func_int **)&PTR__BaseTimeCoordinator_0055c638;
    pBVar4[1]._vptr_BaseTimeCoordinator = (_func_int **)0x8000000000000001;
    *(undefined1 *)
     &pBVar4[1].dependencies.dependencies.
      super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
      super__Vector_impl_data._M_start = 0;
    pBVar4[1].dependencies.dependencies.
    super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x7fffffffffffffff;
    *(undefined2 *)
     &pBVar4[1].dependencies.dependencies.
      super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = 0x100;
  }
  pBVar2 = (this->timeCoord)._M_t.
           super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
           ._M_t.
           super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
           .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
  (this->timeCoord)._M_t.
  super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
  ._M_t.
  super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
  .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl = pBVar4;
  if (pBVar2 != (BaseTimeCoordinator *)0x0) {
    (*pBVar2->_vptr_BaseTimeCoordinator[1])();
  }
  this->hasTimeDependency = true;
LAB_002e301d:
  local_80._8_8_ = 0;
  local_68 = CLI::std::
             _Function_handler<void_(const_helics::ActionMessage_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/BrokerBase.cpp:542:33)>
             ::_M_invoke;
  local_70 = CLI::std::
             _Function_handler<void_(const_helics::ActionMessage_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/BrokerBase.cpp:542:33)>
             ::_M_manager;
  local_80._M_unused._M_object = this;
  BaseTimeCoordinator::setMessageSender
            ((this->timeCoord)._M_t.
             super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
             .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl,
             (function<void_(const_helics::ActionMessage_&)> *)&local_80);
  if (local_70 != (code *)0x0) {
    (*local_70)((_Any_data *)&local_80,(_Any_data *)&local_80,__destroy_functor);
  }
  ((this->timeCoord)._M_t.
   super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
   ._M_t.
   super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
   .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl)->
  restrictive_time_policy = this->restrictive_time_policy;
  local_38._8_8_ = 0;
  local_20 = CLI::std::
             _Function_handler<void_(helics::ActionMessage_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/BrokerBase.cpp:545:38)>
             ::_M_invoke;
  local_28 = CLI::std::
             _Function_handler<void_(helics::ActionMessage_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/BrokerBase.cpp:545:38)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  std::function<void_(helics::ActionMessage_&&)>::operator=
            ((function<void_(helics::ActionMessage_&&)> *)
             &((this->mLogManager).
               super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->mTransmit
             ,(function<void_(helics::ActionMessage_&&)> *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)((_Any_data *)&local_38,(_Any_data *)&local_38,__destroy_functor);
  }
  LogManager::initializeLogging
            ((this->mLogManager).super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,&this->identifier);
  LOCK();
  (this->maxLogLevel).super___atomic_base<int>._M_i =
       (((this->mLogManager).super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->maxLogLevel).super___atomic_base<int>._M_i;
  UNLOCK();
  LOCK();
  (this->mainLoopIsRunning)._M_base._M_i = true;
  UNLOCK();
  local_58._M_dataplus._M_p = (pointer)queueProcessingLoop;
  local_58._M_string_length = 0;
  local_60 = this;
  std::thread::thread<void(helics::BrokerBase::*)(),helics::BrokerBase*,void>
            (&local_88,(offset_in_BrokerBase_to_subr *)&local_58,&local_60);
  if ((this->queueProcessingThread)._M_id._M_thread == 0) {
    (this->queueProcessingThread)._M_id._M_thread = (native_handle_type)local_88._M_id._M_thread;
    LOCK();
    (this->brokerState)._M_i = CONFIGURED;
    UNLOCK();
    return;
  }
  std::terminate();
}

Assistant:

void BrokerBase::configureBase()
{
    if (debugging) {
        no_ping = true;
        disable_timer = true;
    }
    if (networkTimeout < timeZero) {
        networkTimeout = 4.0;
    }

    if (!noAutomaticID) {
        if (identifier.empty()) {
            identifier = genId();
        }
    }

    if (identifier.size() == 36) {
        if (identifier[8] == '-' && identifier[12] == '-' && identifier[16] == '-' &&
            identifier[20] == '-') {
            uuid_like = true;
        }
    }
    if (asyncTime) {
        timeCoord = std::make_unique<AsyncTimeCoordinator>();
        hasTimeDependency = true;
    } else if (globalTime) {
        timeCoord = std::make_unique<GlobalTimeCoordinator>();
        hasTimeDependency = true;
    } else {
        timeCoord = std::make_unique<ForwardingTimeCoordinator>();
    }

    timeCoord->setMessageSender([this](const ActionMessage& msg) { addActionMessage(msg); });
    timeCoord->setRestrictivePolicy(restrictive_time_policy);

    mLogManager->setTransmitCallback([this](ActionMessage&& message) {
        if (getBrokerState() < BrokerState::TERMINATING) {
            message.source_id = global_id.load();
            addActionMessage(std::move(message));
        }
    });
    mLogManager->initializeLogging(identifier);
    maxLogLevel.store(mLogManager->getMaxLevel());
    mainLoopIsRunning.store(true);
    queueProcessingThread = std::thread(&BrokerBase::queueProcessingLoop, this);
    brokerState = BrokerState::CONFIGURED;
}